

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O3

int mriStep_SetLinear(ARKodeMem ark_mem,int timedepend)

{
  int iVar1;
  ARKodeMRIStepMem step_mem;
  ARKodeMRIStepMem local_10;
  
  iVar1 = mriStep_AccessStepMem(ark_mem,"mriStep_SetLinear",&local_10);
  if (iVar1 == 0) {
    local_10->linear = 1;
    local_10->linear_timedep = (uint)(timedepend == 1);
    local_10->dgmax = 2.220446049250313e-14;
  }
  return iVar1;
}

Assistant:

int mriStep_SetLinear(ARKodeMem ark_mem, int timedepend)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* set parameters */
  step_mem->linear         = SUNTRUE;
  step_mem->linear_timedep = (timedepend == 1);
  step_mem->dgmax          = SUN_RCONST(100.0) * SUN_UNIT_ROUNDOFF;

  return (ARK_SUCCESS);
}